

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O1

void client(void *arg)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  char msg [3];
  char local_33 [3];
  
  sVar3 = strlen(local_33);
  iVar4 = -10;
  while( true ) {
    iVar1 = nn_socket(1,0x50);
    if (iVar1 < 0) break;
    iVar2 = nn_connect(iVar1,"ipc://test-stress.ipc");
    if (iVar2 < 0) goto LAB_00101ac8;
    nn_sleep(0x32);
    iVar2 = nn_send(iVar1,local_33,sVar3 + 1,0);
    nn_sleep(100);
    if (sVar3 + 1 != (long)iVar2) goto LAB_00101acd;
    nn_close(iVar1);
    iVar4 = iVar4 + 1;
    if (iVar4 == 0) {
      return;
    }
  }
  client_cold_3();
LAB_00101ac8:
  client_cold_2();
LAB_00101acd:
  client_cold_1();
}

Assistant:

static void client(void *arg)
{
    intptr_t id = (intptr_t)arg;
    int bytes;
    char msg[3];
    size_t sz_msg;
    int i;

    msg[0] = 'A' + id%26;
    msg[1] = 'a';
    msg[2] = '\0';
    /*  '\0' too */
    sz_msg = strlen (msg) + 1;

    for (i = 0; i < TEST_LOOPS; i++) {
        int cli_sock = nn_socket (AF_SP, NN_PUSH);
        msg[1] = 'a' + i%26;
        nn_assert (cli_sock >= 0);
        nn_assert (nn_connect (cli_sock, SOCKET_ADDRESS) >= 0);
        /*  Give time to allow for connect to establish. */
        nn_sleep (50);
        bytes = nn_send (cli_sock, msg, sz_msg, 0);
        /*  This would better be handled via semaphore or condvar. */
        nn_sleep (100);
        nn_assert ((size_t)bytes == sz_msg);
        nn_close (cli_sock);
    }
}